

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5e4c5e::InitListExpr::printLeft(InitListExpr *this,OutputStream *S)

{
  Node *pNVar1;
  size_t sVar2;
  
  pNVar1 = this->Ty;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[4])(pNVar1,S);
    if (pNVar1->RHSComponentCache != No) {
      (*pNVar1->_vptr_Node[5])(pNVar1,S);
    }
  }
  OutputStream::grow(S,1);
  sVar2 = S->CurrentPosition;
  S->CurrentPosition = sVar2 + 1;
  S->Buffer[sVar2] = '{';
  NodeArray::printWithComma(&this->Inits,S);
  OutputStream::grow(S,1);
  sVar2 = S->CurrentPosition;
  S->CurrentPosition = sVar2 + 1;
  S->Buffer[sVar2] = '}';
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Ty)
      Ty->print(S);
    S += '{';
    Inits.printWithComma(S);
    S += '}';
  }